

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionEntryPointInfo * __thiscall Js::FunctionBody::CreateNewDefaultEntryPoint(FunctionBody *this)

{
  ExecutionMode EVar1;
  Recycler *pRVar2;
  FunctionEntryPointInfo *this_00;
  ThreadContext *context;
  FunctionEntryPointInfo *pFVar3;
  FunctionEntryPointInfo *local_e8;
  FunctionEntryPointInfo *local_e0;
  FunctionEntryPointInfo *simpleJitEntryPointInfo;
  JavascriptMethod directEntryPoint;
  JavascriptMethod originalEntryPoint;
  code *pcStack_60;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  TrackAllocData local_50;
  FunctionEntryPointInfo *local_28;
  FunctionEntryPointInfo *entryPointInfo;
  JavascriptMethod currentThunk;
  Recycler *recycler;
  FunctionBody *this_local;
  
  recycler = (Recycler *)this;
  pRVar2 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  entryPointInfo =
       (FunctionEntryPointInfo *)
       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk;
  currentThunk = (JavascriptMethod)pRVar2;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&FunctionEntryPointInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x1af5);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
  pcStack_60 = Memory::Recycler::AllocFinalizedInlined;
  this_00 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x88,pRVar2,0x4642b0);
  pFVar3 = entryPointInfo;
  context = ScriptContext::GetThreadContext
                      ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  FunctionEntryPointInfo::FunctionEntryPointInfo
            (this_00,(FunctionProxy *)this,(JavascriptMethod)pFVar3,context);
  local_28 = this_00;
  AddEntryPointToEntryPointList(this,this_00);
  AutoFilterExceptionRegion::AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)((long)&originalEntryPoint + 4),ExceptionType_All);
  pFVar3 = GetSimpleJitEntryPointInfo(this);
  if (pFVar3 != (FunctionEntryPointInfo *)0x0) {
    EVar1 = GetExecutionMode(this);
    if (EVar1 == FullJit) {
      simpleJitEntryPointInfo =
           (FunctionEntryPointInfo *)
           EntryPointInfo::GetNativeEntrypoint(&pFVar3->super_EntryPointInfo);
      directEntryPoint = (JavascriptMethod)simpleJitEntryPointInfo;
      goto LAB_00a24cd7;
    }
  }
  if ((this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk == (Type)0x0) {
    local_e0 = (FunctionEntryPointInfo *)InterpreterStackFrame::DelayDynamicInterpreterThunk;
  }
  else {
    local_e0 = (FunctionEntryPointInfo *)
               InterpreterThunkEmitter::ConvertToEntryPoint
                         ((this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk);
  }
  directEntryPoint = (JavascriptMethod)local_e0;
  if (entryPointInfo ==
      (FunctionEntryPointInfo *)InterpreterStackFrame::DelayDynamicInterpreterThunk) {
    local_e8 = local_e0;
  }
  else {
    local_e8 = entryPointInfo;
  }
  simpleJitEntryPointInfo = local_e8;
LAB_00a24cd7:
  (local_28->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod =
       (Type)simpleJitEntryPointInfo;
  SetDefaultFunctionEntryPointInfo(this,local_28,directEntryPoint);
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)((long)&originalEntryPoint + 4));
  return local_28;
}

Assistant:

FunctionEntryPointInfo* FunctionBody::CreateNewDefaultEntryPoint()
    {
        Recycler *const recycler = this->m_scriptContext->GetRecycler();
        const JavascriptMethod currentThunk = m_scriptContext->CurrentThunk;

        FunctionEntryPointInfo *const entryPointInfo =
            RecyclerNewFinalized(
                recycler,
                FunctionEntryPointInfo,
                this,
                currentThunk,
                m_scriptContext->GetThreadContext());

        AddEntryPointToEntryPointList(entryPointInfo);

        {
            // Allocations in this region may trigger expiry and cause unexpected changes to state
            AUTO_NO_EXCEPTION_REGION;

            Js::JavascriptMethod originalEntryPoint, directEntryPoint;

#if ENABLE_NATIVE_CODEGEN
            FunctionEntryPointInfo *const simpleJitEntryPointInfo = GetSimpleJitEntryPointInfo();
            if(simpleJitEntryPointInfo && GetExecutionMode() == ExecutionMode::FullJit)
            {
                directEntryPoint =
                    originalEntryPoint = simpleJitEntryPointInfo->GetNativeEntrypoint();
            }
            else
#endif
            {
#if DYNAMIC_INTERPRETER_THUNK
                // If the dynamic interpreter thunk hasn't been created yet, then the entry point can be set to
                // the default entry point. Otherwise, since the new default entry point is being created to
                // move back to the interpreter, the original entry point is going to be the dynamic interpreter thunk
                originalEntryPoint =
                    m_dynamicInterpreterThunk
                        ? reinterpret_cast<JavascriptMethod>(InterpreterThunkEmitter::ConvertToEntryPoint(m_dynamicInterpreterThunk))
                        : DefaultEntryThunk;
#else
                originalEntryPoint = DefaultEntryThunk;
#endif

                directEntryPoint = currentThunk == DefaultEntryThunk ? originalEntryPoint : currentThunk;
            }

            entryPointInfo->jsMethod = directEntryPoint;
            SetDefaultFunctionEntryPointInfo(entryPointInfo, originalEntryPoint);
        }

        return entryPointInfo;
    }